

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Append(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char **__filename;
  bool bVar1;
  int iVar2;
  FILE *__stream;
  Gia_Man_t *pTwo;
  char *pcVar3;
  int fVerbose;
  int c;
  int nArgcNew;
  char **pArgvNew;
  char *pTemp;
  char *FileName;
  Gia_Man_t *pSecond;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 == -1) {
      if (argc - globalUtilOptind == 1) {
        __filename = (char **)argv[globalUtilOptind];
        for (pArgvNew = __filename; *(char *)pArgvNew != '\0';
            pArgvNew = (char **)((long)pArgvNew + 1)) {
          if (*(char *)pArgvNew == '>') {
            *(undefined1 *)pArgvNew = 0x5c;
          }
        }
        __stream = fopen((char *)__filename,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",__filename);
          pcVar3 = Extra_FileGetSimilarName
                             ((char *)__filename,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                              (char *)0x0);
          if (pcVar3 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
          }
          Abc_Print(1,"\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          fclose(__stream);
          pTwo = Gia_AigerRead((char *)__filename,0,0,0);
          if (pTwo == (Gia_Man_t *)0x0) {
            Abc_Print(-1,"Reading AIGER has failed.\n");
            pAbc_local._4_4_ = 0;
          }
          else {
            Gia_ManDupAppend(pAbc->pGia,pTwo);
            Gia_ManStop(pTwo);
            pAbc_local._4_4_ = 0;
          }
        }
      }
      else {
        Abc_Print(-1,"File name is not given on the command line.\n");
        pAbc_local._4_4_ = 1;
      }
      return pAbc_local._4_4_;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  Abc_Print(-2,"usage: &append [-vh] <file>\n");
  Abc_Print(-2,"\t         appends <file> to the current AIG using new PIs and POs\n");
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : AIGER file with the design to miter\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Append( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    Gia_ManDupAppend( pAbc->pGia, pSecond );
    Gia_ManStop( pSecond );
    return 0;

usage:
    Abc_Print( -2, "usage: &append [-vh] <file>\n" );
    Abc_Print( -2, "\t         appends <file> to the current AIG using new PIs and POs\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the design to miter\n");
    return 1;
}